

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O1

int __thiscall simple_thread_pool::ThreadPoolMgr::init(ThreadPoolMgr *this,EVP_PKEY_CTX *ctx)

{
  undefined2 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  thread *ptVar5;
  ThreadHandle *__p;
  __hashtable *__h;
  shared_ptr<simple_thread_pool::ThreadHandle> t_handle;
  ThreadHandle *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  thread *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  pthread_mutex_t *local_40;
  ThreadPoolMgr *local_38;
  
  uVar1 = *(undefined2 *)(ctx + 0x10);
  (this->myOpt).invokeCanceledTask = (bool)(char)uVar1;
  (this->myOpt).activeWorkerMode = (bool)(char)((ushort)uVar1 >> 8);
  sVar2 = *(size_t *)(ctx + 8);
  (this->myOpt).numInitialThreads = *(size_t *)ctx;
  (this->myOpt).busyWaitingIntervalUs = sVar2;
  LOCK();
  (this->stopSignal)._M_base._M_i = false;
  UNLOCK();
  ptVar5 = (thread *)operator_new(8);
  local_68 = (ThreadHandle *)loop;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = this;
  std::thread::
  thread<void(simple_thread_pool::ThreadPoolMgr::*)(),simple_thread_pool::ThreadPoolMgr*,void>
            (ptVar5,(offset_in_ThreadPoolMgr_to_subr *)&local_68,&local_38);
  local_58 = ptVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::thread*>(&_Stack_50,ptVar5);
  _Var3._M_pi = _Stack_50._M_pi;
  ptVar5 = local_58;
  local_58 = (thread *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->loopThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->loopThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr = ptVar5;
  (this->loopThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((ThreadHandle *)_Stack_50._M_pi != (ThreadHandle *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  local_40 = (pthread_mutex_t *)&this->idleThreadsLock;
  iVar4 = pthread_mutex_lock(local_40);
  if (iVar4 == 0) {
    if ((this->myOpt).numInitialThreads != 0) {
      ptVar5 = (thread *)0x0;
      do {
        __p = (ThreadHandle *)operator_new(200);
        __p->myId = (size_t)ptVar5;
        __p->mgr = &this->super_ThreadPoolMgrBase;
        (__p->eaLoop).cvLock.super___mutex_base._M_mutex.__align = 0;
        *(undefined8 *)((long)&(__p->eaLoop).cvLock.super___mutex_base._M_mutex + 8) = 0;
        *(undefined8 *)((long)&(__p->eaLoop).cvLock.super___mutex_base._M_mutex + 0x10) = 0;
        (__p->eaLoop).cvLock.super___mutex_base._M_mutex.__data.__list.__prev =
             (__pthread_internal_list *)0x0;
        (__p->eaLoop).cvLock.super___mutex_base._M_mutex.__data.__list.__next =
             (__pthread_internal_list *)0x0;
        (__p->myself).
        super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (__p->myself).
        super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (__p->tHandle).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (__p->tHandle).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (__p->assignedTask).
        super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (__p->assignedTask).
        super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (__p->assignedTaskLock).super___mutex_base._M_mutex.__align = 0;
        *(undefined8 *)((long)&(__p->assignedTaskLock).super___mutex_base._M_mutex + 8) = 0;
        *(undefined8 *)((long)&(__p->assignedTaskLock).super___mutex_base._M_mutex + 0x10) = 0;
        (__p->assignedTaskLock).super___mutex_base._M_mutex.__data.__list.__prev =
             (__pthread_internal_list *)0x0;
        *(undefined8 *)
         ((long)&(__p->assignedTaskLock).super___mutex_base._M_mutex.__data.__list.__prev + 4) = 0;
        *(undefined8 *)
         ((long)&(__p->assignedTaskLock).super___mutex_base._M_mutex.__data.__list.__next + 4) = 0;
        std::condition_variable::condition_variable(&(__p->eaLoop).cv);
        local_68 = __p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<simple_thread_pool::ThreadHandle*>(&local_60,__p);
        _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68;
        local_48 = local_60._M_pi;
        if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
          }
        }
        local_58 = ptVar5;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->idleThreads,&local_58);
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
        }
        ThreadHandle::init(local_68,(EVP_PKEY_CTX *)&local_68);
        if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
        }
        ptVar5 = (thread *)((long)&(ptVar5->_M_id)._M_thread + 1);
      } while (ptVar5 < (thread *)(this->myOpt).numInitialThreads);
    }
    iVar4 = pthread_mutex_unlock(local_40);
    return iVar4;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void init(const ThreadPoolOptions& opt) {
        myOpt = opt;
        stopSignal = false;

        loopThread = std::shared_ptr<std::thread>
                     ( new std::thread( &ThreadPoolMgr::loop, this ) );

        {   std::lock_guard<std::mutex> l(idleThreadsLock);
            for (size_t ii = 0; ii < myOpt.numInitialThreads; ++ii) {
                std::shared_ptr<ThreadHandle> t_handle( new ThreadHandle(this, ii) );
                idleThreads.insert({ii, t_handle});
                t_handle->init(t_handle);
            }
        }
    }